

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O2

ostream * operator<<(ostream *os,vector_<char> *vector)

{
  ostream *poVar1;
  int i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < vector->_size; uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<(os,(vector->arr)._M_t.
                                super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar2]);
    std::operator<<(poVar1," ");
  }
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const vector_ &vector) {
        for (int i = 0; i < vector._size; i++) {
            os << vector.arr[i] << " ";
        }
        return os;
    }